

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

Error asmjit::v1_14::Formatter::formatData
                (String *sb,FormatFlags formatFlags,Arch arch,TypeId typeId,void *data,
                size_t itemCount,size_t repeatCount)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  Error EVar4;
  uint64_t i_00;
  size_t i;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  if (kMIPS64_BE < arch) {
    return 4;
  }
  bVar1 = TypeUtils::_typeData[(ulong)typeId + 0x100];
  if (bVar1 == 0) {
    EVar4 = 3;
  }
  else {
    uVar3 = (uint)bVar1;
    bVar9 = (uVar3 & bVar1 - 1) != 0;
    uVar6 = 1;
    if (bVar9) {
      uVar6 = (ulong)uVar3;
    }
    uVar8 = 1;
    if (!bVar9) {
      uVar8 = (ulong)uVar3;
    }
    lVar7 = uVar6 * itemCount;
    while (uVar3 = (uint)uVar8, 8 < uVar3) {
      lVar7 = lVar7 * 2;
      uVar8 = (ulong)(uVar3 >> 1);
    }
    uVar2 = 0;
    if (uVar3 != 0) {
      for (; (uVar3 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    bVar1 = *(byte *)((ulong)uVar2 + (ulong)arch * 0xd8 + 0x1470d4);
    if ((repeatCount < 2) || (EVar4 = String::_opFormat(sb,kAppend,".repeat %zu "), EVar4 == 0)) {
      String::_opChar(sb,kAppend,'.');
      String::_opString(sb,kAppend,&wordNameTable + (ulong)bVar1 * 8,0xffffffffffffffff);
      String::_opChar(sb,kAppend,' ');
      for (lVar5 = 0; lVar7 != lVar5; lVar5 = lVar5 + 1) {
        if ((lVar5 != 0) && (EVar4 = String::_opString(sb,kAppend,", ",2), EVar4 != 0)) {
          return EVar4;
        }
        i_00 = 0;
        switch(uVar3) {
        case 1:
          i_00 = (uint64_t)(byte)*data;
          break;
        case 2:
          i_00 = (uint64_t)(ushort)*data;
          break;
        case 4:
          i_00 = (uint64_t)(uint)*data;
          break;
        case 8:
          i_00 = *data;
        }
        EVar4 = String::_opNumber(sb,kAppend,i_00,0x10,(ulong)(uVar3 * 2),kAlternate);
        if (EVar4 != 0) {
          return EVar4;
        }
        data = (void *)((long)data + uVar8);
      }
      EVar4 = 0;
    }
  }
  return EVar4;
}

Assistant:

Error formatData(
  String& sb,
  FormatFlags formatFlags,
  Arch arch,
  TypeId typeId, const void* data, size_t itemCount, size_t repeatCount) noexcept
{
  DebugUtils::unused(formatFlags);

  if (ASMJIT_UNLIKELY(!Environment::isDefinedArch(arch)))
    return DebugUtils::errored(kErrorInvalidArch);

  uint32_t typeSize = TypeUtils::sizeOf(typeId);
  if (typeSize == 0)
    return DebugUtils::errored(kErrorInvalidState);

  if (!Support::isPowerOf2(typeSize)) {
    itemCount *= typeSize;
    typeSize = 1;
  }

  while (typeSize > 8u) {
    typeSize >>= 1;
    itemCount <<= 1;
  }

  uint32_t typeSizeLog2 = Support::ctz(typeSize);
  const char* wordName = wordNameTable[size_t(ArchTraits::byArch(arch).typeNameIdByIndex(typeSizeLog2))];

  if (repeatCount > 1)
    ASMJIT_PROPAGATE(sb.appendFormat(".repeat %zu ", repeatCount));

  return formatDataHelper(sb, wordName, typeSize, static_cast<const uint8_t*>(data), itemCount);
}